

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDV.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Storage::MassStorage::HDV::get_block
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,HDV *this,
          size_t address)

{
  long lVar1;
  void *__buf;
  size_t in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78 [2];
  undefined1 local_48 [32];
  long file_offset;
  ssize_t source_address;
  size_t address_local;
  HDV *this_local;
  
  source_address = address;
  address_local = (size_t)this;
  this_local = (HDV *)__return_storage_ptr__;
  file_offset = Encodings::Apple::
                PartitionMap<Storage::MassStorage::Encodings::AppleII::VolumeProvider>::
                to_source_address(&this->mapper_,address);
  local_48._24_8_ = offset_for_block(this,file_offset);
  lVar1 = file_offset;
  if (file_offset < 0) {
    local_78[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_78);
    Encodings::Apple::PartitionMap<Storage::MassStorage::Encodings::AppleII::VolumeProvider>::
    convert_source_block(__return_storage_ptr__,&this->mapper_,lVar1,local_78);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_78);
  }
  else {
    FileHolder::seek(&this->file_,local_48._24_8_,0);
    lVar1 = file_offset;
    __buf = (void *)get_block_size(this);
    FileHolder::read((FileHolder *)local_48,(int)&this->file_,__buf,in_RCX);
    Encodings::Apple::PartitionMap<Storage::MassStorage::Encodings::AppleII::VolumeProvider>::
    convert_source_block
              (__return_storage_ptr__,&this->mapper_,lVar1,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> HDV::get_block(size_t address) {
	const auto source_address = mapper_.to_source_address(address);
	const auto file_offset = offset_for_block(source_address);

	if(source_address >= 0) {
		file_.seek(file_offset, SEEK_SET);
		return mapper_.convert_source_block(source_address, file_.read(get_block_size()));
	} else {
		return mapper_.convert_source_block(source_address);
	}
}